

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Traversal.cpp
# Opt level: O2

bool __thiscall
iDynTree::Traversal::addTraversalElement
          (Traversal *this,Link *link,IJoint *jointToParent,Link *parentLink)

{
  pointer ppLVar1;
  pointer ppLVar2;
  LinkIndex LVar3;
  Link *local_40;
  IJoint *local_38;
  Link *local_30;
  
  ppLVar1 = (this->links).
            super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppLVar2 = (this->links).
            super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_40 = parentLink;
  local_38 = jointToParent;
  local_30 = link;
  LVar3 = Link::getIndex(link);
  (this->linkIndexToTraversalIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[LVar3] = (int)((ulong)((long)ppLVar1 - (long)ppLVar2) >> 3);
  std::vector<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>::push_back
            (&this->links,&local_30);
  std::vector<const_iDynTree::IJoint_*,_std::allocator<const_iDynTree::IJoint_*>_>::push_back
            (&this->toParentJoints,&local_38);
  std::vector<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>::push_back
            (&this->parents,&local_40);
  return true;
}

Assistant:

bool Traversal::addTraversalElement(const Link* link, const IJoint* jointToParent, const Link* parentLink)
{
    // The traversal index of the link just added will be the current getNrOfVisitedLinks()
    this->linkIndexToTraversalIndex[link->getIndex()] = this->getNrOfVisitedLinks();

    this->links.push_back(link);
    this->toParentJoints.push_back(jointToParent);
    this->parents.push_back(parentLink);

    return true;
}